

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool __thiscall
ClipperLib::Clipper::Execute
          (Clipper *this,ClipType clipType,PolyTree *polytree,PolyFillType subjFillType,
          PolyFillType clipFillType)

{
  char cVar1;
  int iVar2;
  
  if (this->m_ExecuteLocked == false) {
    this->m_ExecuteLocked = true;
    this->m_SubjFillType = subjFillType;
    this->m_ClipFillType = clipFillType;
    this->m_ClipType = clipType;
    this->m_UsingPolyTree = true;
    iVar2 = (**this->_vptr_Clipper)();
    cVar1 = (char)iVar2;
    if (cVar1 != '\0') {
      BuildResult2(this,polytree);
    }
    ClipperBase::DisposeAllOutRecs
              ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]));
    this->m_ExecuteLocked = false;
  }
  else {
    cVar1 = '\0';
  }
  return (bool)cVar1;
}

Assistant:

bool Clipper::Execute(ClipType clipType, PolyTree& polytree,
    PolyFillType subjFillType, PolyFillType clipFillType)
{
  if( m_ExecuteLocked ) return false;
  m_ExecuteLocked = true;
  m_SubjFillType = subjFillType;
  m_ClipFillType = clipFillType;
  m_ClipType = clipType;
  m_UsingPolyTree = true;
  bool succeeded = ExecuteInternal();
  if (succeeded) BuildResult2(polytree);
  DisposeAllOutRecs();
  m_ExecuteLocked = false;
  return succeeded;
}